

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadSpecs(CrateReader *this)

{
  value_type vVar1;
  SpecType SVar2;
  long lVar3;
  StreamReader *pSVar4;
  void *pvVar5;
  ulong uVar6;
  bool bVar7;
  size_type sVar8;
  ostream *poVar9;
  reference pvVar10;
  size_t __new_size;
  size_t __new_size_00;
  void *pvVar11;
  char *pcVar12;
  uint *puVar13;
  char *pcVar14;
  size_t sVar15;
  reference pvVar16;
  SpecType *pSVar17;
  reference pvVar18;
  size_type local_2068;
  size_t i_2;
  ostringstream local_2040 [8];
  ostringstream ss_e_18;
  undefined1 local_1ec8 [8];
  string err_2;
  ostringstream local_1e88 [8];
  ostringstream ss_e_17;
  string local_1d10;
  ostringstream local_1cf0 [8];
  ostringstream ss_e_16;
  void *local_1b78;
  uint64_t spectype_size;
  size_t i_1;
  ostringstream local_1b48 [8];
  ostringstream ss_e_15;
  undefined1 local_19d0 [8];
  string err_1;
  ostringstream local_1990 [8];
  ostringstream ss_e_14;
  string local_1818;
  ostringstream local_17f8 [8];
  ostringstream ss_e_13;
  void *local_1680;
  uint64_t fset_indexes_size;
  size_t i;
  ostringstream local_1650 [8];
  ostringstream ss_e_12;
  undefined1 local_14d8 [8];
  string err;
  ostringstream local_1498 [8];
  ostringstream ss_e_11;
  string local_1320;
  ostringstream local_1300 [8];
  ostringstream ss_e_10;
  void *local_1188;
  uint64_t path_indexes_size;
  vector<char,_std::allocator<char>_> working_space;
  ostringstream local_1148 [8];
  ostringstream ss_e_9;
  size_t workBufferSize;
  undefined1 local_fc0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  string local_fa0;
  ostringstream local_f80 [8];
  ostringstream ss_e_8;
  undefined1 local_e08 [8];
  vector<char,_std::allocator<char>_> comp_buffer;
  ostringstream local_dd0 [8];
  ostringstream ss_e_7;
  size_t compBufferSize;
  ostringstream local_c30 [8];
  ostringstream ss_e_6;
  string local_ab8;
  ostringstream local_a98 [8];
  ostringstream ss_e_5;
  string local_920;
  ostringstream local_900 [8];
  ostringstream ss_e_4;
  string local_788;
  ostringstream local_768 [8];
  ostringstream ss_e_3;
  ulong local_5f0;
  uint64_t num_specs;
  ostringstream local_5c8 [8];
  ostringstream ss_e_2;
  Section *s;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  ostringstream local_328 [8];
  ostringstream ss_e_1;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream ss_e;
  CrateReader *this_local;
  
  if (-1 < this->_specs_index) {
    lVar3 = this->_specs_index;
    sVar8 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::size
                      (&(this->_toc).sections);
    if (lVar3 < (long)sVar8) {
      if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
        ::std::__cxx11::ostringstream::ostringstream(local_328);
        poVar9 = ::std::operator<<((ostream *)local_328,"[error]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1745);
        ::std::operator<<(poVar9," ");
        ::std::__cxx11::to_string(&local_3e8,(uint)this->_version[0]);
        ::std::operator+((char *)local_3c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Version must be 0.4.0 or later, but got ");
        ::std::operator+(local_3a8,(char *)local_3c8);
        ::std::__cxx11::to_string(&local_408,(uint)this->_version[1]);
        ::std::operator+(local_388,local_3a8);
        ::std::operator+(local_368,(char *)local_388);
        ::std::__cxx11::to_string(&local_428,(uint)this->_version[2]);
        ::std::operator+(local_348,local_368);
        poVar9 = ::std::operator<<((ostream *)local_328,(string *)local_348);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::~string((string *)local_348);
        ::std::__cxx11::string::~string((string *)&local_428);
        ::std::__cxx11::string::~string((string *)local_368);
        ::std::__cxx11::string::~string((string *)local_388);
        ::std::__cxx11::string::~string((string *)&local_408);
        ::std::__cxx11::string::~string((string *)local_3a8);
        ::std::__cxx11::string::~string(local_3c8);
        ::std::__cxx11::string::~string((string *)&local_3e8);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&s);
        ::std::__cxx11::string::~string((string *)&s);
        ::std::__cxx11::ostringstream::~ostringstream(local_328);
        this_local._7_1_ = 0;
      }
      else {
        pvVar10 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                  ::operator[](&(this->_toc).sections,this->_specs_index);
        bVar7 = StreamReader::seek_set(this->_sr,pvVar10->start);
        if (bVar7) {
          bVar7 = StreamReader::read8(this->_sr,&local_5f0);
          if (bVar7) {
            if ((this->_config).maxNumSpecifiers < local_5f0) {
              ::std::__cxx11::ostringstream::ostringstream(local_900);
              poVar9 = ::std::operator<<((ostream *)local_900,"[error]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1757);
              ::std::operator<<(poVar9," ");
              poVar9 = ::std::operator<<((ostream *)local_900,"Too many specs in `SPECS` section.");
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_920);
              ::std::__cxx11::string::~string((string *)&local_920);
              ::std::__cxx11::ostringstream::~ostringstream(local_900);
              this_local._7_1_ = 0;
            }
            else if (local_5f0 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_a98);
              poVar9 = ::std::operator<<((ostream *)local_a98,"[error]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x175d);
              ::std::operator<<(poVar9," ");
              poVar9 = ::std::operator<<((ostream *)local_a98,"`SPECS` is empty.");
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_ab8);
              ::std::__cxx11::string::~string((string *)&local_ab8);
              ::std::__cxx11::ostringstream::~ostringstream(local_a98);
              this_local._7_1_ = 0;
            }
            else {
              this->_memoryUsage = local_5f0 * 0xc + this->_memoryUsage;
              if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                ::std::__cxx11::ostringstream::ostringstream(local_c30);
                poVar9 = ::std::operator<<((ostream *)local_c30,"[error]");
                poVar9 = ::std::operator<<(poVar9,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar9 = ::std::operator<<(poVar9,"[Crate]");
                poVar9 = ::std::operator<<(poVar9,":");
                poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                poVar9 = ::std::operator<<(poVar9,"():");
                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1763);
                ::std::operator<<(poVar9," ");
                poVar9 = ::std::operator<<((ostream *)local_c30,"Reached to max memory budget.");
                ::std::operator<<(poVar9,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&compBufferSize);
                ::std::__cxx11::string::~string((string *)&compBufferSize);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_c30);
              }
              else {
                ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::resize
                          (&this->_specs,local_5f0);
                __new_size = Usd_IntegerCompression::GetCompressedBufferSize(local_5f0);
                this->_memoryUsage = __new_size + this->_memoryUsage;
                if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                  ::std::__cxx11::ostringstream::ostringstream(local_dd0);
                  poVar9 = ::std::operator<<((ostream *)local_dd0,"[error]");
                  poVar9 = ::std::operator<<(poVar9,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar9 = ::std::operator<<(poVar9,"[Crate]");
                  poVar9 = ::std::operator<<(poVar9,":");
                  poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                  poVar9 = ::std::operator<<(poVar9,"():");
                  poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x176d);
                  ::std::operator<<(poVar9," ");
                  poVar9 = ::std::operator<<((ostream *)local_dd0,"Reached to max memory budget.");
                  ::std::operator<<(poVar9,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)
                                 &comp_buffer.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.field_0x10);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &comp_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_dd0);
                }
                else {
                  ::std::vector<char,_std::allocator<char>_>::vector
                            ((vector<char,_std::allocator<char>_> *)local_e08);
                  ::std::vector<char,_std::allocator<char>_>::resize
                            ((vector<char,_std::allocator<char>_> *)local_e08,__new_size);
                  uVar6 = local_5f0;
                  this->_memoryUsage = local_5f0 * 4 + this->_memoryUsage;
                  if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                    ::std::__cxx11::ostringstream::ostringstream(local_f80);
                    poVar9 = ::std::operator<<((ostream *)local_f80,"[error]");
                    poVar9 = ::std::operator<<(poVar9,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar9 = ::std::operator<<(poVar9,"[Crate]");
                    poVar9 = ::std::operator<<(poVar9,":");
                    poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                    poVar9 = ::std::operator<<(poVar9,"():");
                    poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1772);
                    ::std::operator<<(poVar9," ");
                    poVar9 = ::std::operator<<((ostream *)local_f80,"Reached to max memory budget.")
                    ;
                    ::std::operator<<(poVar9,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_fa0);
                    ::std::__cxx11::string::~string((string *)&local_fa0);
                    this_local._7_1_ = 0;
                    tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_f80);
                  }
                  else {
                    ::std::allocator<unsigned_int>::allocator
                              ((allocator<unsigned_int> *)((long)&workBufferSize + 7));
                    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_fc0,
                               uVar6,(allocator_type *)((long)&workBufferSize + 7));
                    ::std::allocator<unsigned_int>::~allocator
                              ((allocator<unsigned_int> *)((long)&workBufferSize + 7));
                    __new_size_00 =
                         Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(local_5f0);
                    this->_memoryUsage = __new_size_00 + this->_memoryUsage;
                    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
                      ::std::__cxx11::ostringstream::ostringstream(local_1148);
                      poVar9 = ::std::operator<<((ostream *)local_1148,"[error]");
                      poVar9 = ::std::operator<<(poVar9,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar9 = ::std::operator<<(poVar9,"[Crate]");
                      poVar9 = ::std::operator<<(poVar9,":");
                      poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                      poVar9 = ::std::operator<<(poVar9,"():");
                      poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1779);
                      ::std::operator<<(poVar9," ");
                      poVar9 = ::std::operator<<((ostream *)local_1148,
                                                 "Reached to max memory budget.");
                      ::std::operator<<(poVar9,"\n");
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,(string *)
                                     &working_space.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10);
                      ::std::__cxx11::string::~string
                                ((string *)
                                 &working_space.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.field_0x10);
                      this_local._7_1_ = 0;
                      tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1148);
                    }
                    else {
                      ::std::vector<char,_std::allocator<char>_>::vector
                                ((vector<char,_std::allocator<char>_> *)&path_indexes_size);
                      ::std::vector<char,_std::allocator<char>_>::resize
                                ((vector<char,_std::allocator<char>_> *)&path_indexes_size,
                                 __new_size_00);
                      bVar7 = StreamReader::read8(this->_sr,(uint64_t *)&local_1188);
                      pvVar5 = local_1188;
                      if (bVar7) {
                        pvVar11 = (void *)::std::vector<char,_std::allocator<char>_>::size
                                                    ((vector<char,_std::allocator<char>_> *)
                                                     local_e08);
                        if (pvVar11 < pvVar5) {
                          local_1188 = (void *)::std::vector<char,_std::allocator<char>_>::size
                                                         ((vector<char,_std::allocator<char>_> *)
                                                          local_e08);
                        }
                        pvVar5 = local_1188;
                        pSVar4 = this->_sr;
                        pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                            ((vector<char,_std::allocator<char>_> *)local_e08);
                        pvVar11 = (void *)StreamReader::read(pSVar4,(int)pvVar5,pvVar5,
                                                             (size_t)pcVar12);
                        if (pvVar5 == pvVar11) {
                          ::std::__cxx11::string::string((string *)local_14d8);
                          pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                              ((vector<char,_std::allocator<char>_> *)local_e08);
                          pvVar5 = local_1188;
                          puVar13 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                              ((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)local_fc0);
                          uVar6 = local_5f0;
                          pcVar14 = std::vector<char,_std::allocator<char>_>::data
                                              ((vector<char,_std::allocator<char>_> *)
                                               &path_indexes_size);
                          sVar15 = Usd_IntegerCompression::DecompressFromBuffer
                                             (pcVar12,(size_t)pvVar5,puVar13,uVar6,
                                              (string *)local_14d8,pcVar14);
                          if (sVar15 == 0) {
                            ::std::__cxx11::ostringstream::ostringstream(local_1650);
                            poVar9 = ::std::operator<<((ostream *)local_1650,"[error]");
                            poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                            poVar9 = ::std::operator<<(poVar9,":");
                            poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                            poVar9 = ::std::operator<<(poVar9,"():");
                            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1795);
                            ::std::operator<<(poVar9," ");
                            poVar9 = ::std::operator<<((ostream *)local_1650,
                                                                                                              
                                                  "Failed to decode pathIndexes at `SPECS` section."
                                                  );
                            ::std::operator<<(poVar9,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,(string *)&i);
                            ::std::__cxx11::string::~string((string *)&i);
                            ::std::__cxx11::ostringstream::~ostringstream(local_1650);
                            this_local._7_1_ = 0;
                            tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                          }
                          else {
                            for (fset_indexes_size = 0; fset_indexes_size < local_5f0;
                                fset_indexes_size = fset_indexes_size + 1) {
                              pvVar16 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                        operator[]((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_fc0,fset_indexes_size);
                              vVar1 = *pvVar16;
                              pvVar18 = ::std::
                                        vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                        ::operator[](&this->_specs,fset_indexes_size);
                              (pvVar18->path_index).value = vVar1;
                            }
                            tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                          }
                          ::std::__cxx11::string::~string((string *)local_14d8);
                          if (tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                            bVar7 = StreamReader::read8(this->_sr,(uint64_t *)&local_1680);
                            pvVar5 = local_1680;
                            if (bVar7) {
                              pvVar11 = (void *)::std::vector<char,_std::allocator<char>_>::size
                                                          ((vector<char,_std::allocator<char>_> *)
                                                           local_e08);
                              if (pvVar11 < pvVar5) {
                                local_1680 = (void *)::std::vector<char,_std::allocator<char>_>::
                                                     size((vector<char,_std::allocator<char>_> *)
                                                          local_e08);
                              }
                              pvVar5 = local_1680;
                              pSVar4 = this->_sr;
                              pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                                  ((vector<char,_std::allocator<char>_> *)local_e08)
                              ;
                              pvVar11 = (void *)StreamReader::read(pSVar4,(int)pvVar5,pvVar5,
                                                                   (size_t)pcVar12);
                              if (pvVar5 == pvVar11) {
                                ::std::__cxx11::string::string((string *)local_19d0);
                                pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                                    ((vector<char,_std::allocator<char>_> *)
                                                     local_e08);
                                pvVar5 = local_1680;
                                puVar13 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>
                                          ::data((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_fc0);
                                uVar6 = local_5f0;
                                pcVar14 = std::vector<char,_std::allocator<char>_>::data
                                                    ((vector<char,_std::allocator<char>_> *)
                                                     &path_indexes_size);
                                sVar15 = Usd_IntegerCompression::DecompressFromBuffer
                                                   (pcVar12,(size_t)pvVar5,puVar13,uVar6,
                                                    (string *)local_19d0,pcVar14);
                                if (sVar15 == 0) {
                                  ::std::__cxx11::ostringstream::ostringstream(local_1b48);
                                  poVar9 = ::std::operator<<((ostream *)local_1b48,"[error]");
                                  poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                  poVar9 = ::std::operator<<(poVar9,":");
                                  poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                                  poVar9 = ::std::operator<<(poVar9,"():");
                                  poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x17b7);
                                  ::std::operator<<(poVar9," ");
                                  poVar9 = ::std::operator<<((ostream *)local_1b48,
                                                                                                                          
                                                  "Failed to decode fieldset indices at `SPECS` section."
                                                  );
                                  ::std::operator<<(poVar9,"\n");
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,(string *)&i_1);
                                  ::std::__cxx11::string::~string((string *)&i_1);
                                  ::std::__cxx11::ostringstream::~ostringstream(local_1b48);
                                  this_local._7_1_ = 0;
                                  tmp.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                                }
                                else {
                                  for (spectype_size = 0; spectype_size != local_5f0;
                                      spectype_size = spectype_size + 1) {
                                    pvVar16 = ::std::
                                              vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                              operator[]((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_fc0,spectype_size);
                                    vVar1 = *pvVar16;
                                    pvVar18 = ::std::
                                              vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                              ::operator[](&this->_specs,spectype_size);
                                    (pvVar18->fieldset_index).value = vVar1;
                                  }
                                  tmp.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                }
                                ::std::__cxx11::string::~string((string *)local_19d0);
                                if (tmp.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                                  bVar7 = StreamReader::read8(this->_sr,(uint64_t *)&local_1b78);
                                  pvVar5 = local_1b78;
                                  if (bVar7) {
                                    pvVar11 = (void *)::std::vector<char,_std::allocator<char>_>::
                                                      size((vector<char,_std::allocator<char>_> *)
                                                           local_e08);
                                    if (pvVar11 < pvVar5) {
                                      local_1b78 = (void *)::std::
                                                  vector<char,_std::allocator<char>_>::size
                                                            ((vector<char,_std::allocator<char>_> *)
                                                             local_e08);
                                    }
                                    pvVar5 = local_1b78;
                                    pSVar4 = this->_sr;
                                    pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                                        ((vector<char,_std::allocator<char>_> *)
                                                         local_e08);
                                    pvVar11 = (void *)StreamReader::read(pSVar4,(int)pvVar5,pvVar5,
                                                                         (size_t)pcVar12);
                                    if (pvVar5 == pvVar11) {
                                      ::std::__cxx11::string::string((string *)local_1ec8);
                                      pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                                          ((vector<char,_std::allocator<char>_> *)
                                                           local_e08);
                                      pvVar5 = local_1b78;
                                      puVar13 = ::std::
                                                vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                ::data((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_fc0);
                                      uVar6 = local_5f0;
                                      pcVar14 = std::vector<char,_std::allocator<char>_>::data
                                                          ((vector<char,_std::allocator<char>_> *)
                                                           &path_indexes_size);
                                      sVar15 = Usd_IntegerCompression::DecompressFromBuffer
                                                         (pcVar12,(size_t)pvVar5,puVar13,uVar6,
                                                          (string *)local_1ec8,pcVar14);
                                      if (sVar15 == 0) {
                                        ::std::__cxx11::ostringstream::ostringstream(local_2040);
                                        poVar9 = ::std::operator<<((ostream *)local_2040,"[error]");
                                        poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                        poVar9 = ::std::operator<<(poVar9,":");
                                        poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                                        poVar9 = ::std::operator<<(poVar9,"():");
                                        poVar9 = (ostream *)
                                                 ::std::ostream::operator<<(poVar9,0x17d9);
                                        ::std::operator<<(poVar9," ");
                                        poVar9 = ::std::operator<<((ostream *)local_2040,
                                                                                                                                      
                                                  "Failed to decode fieldset indices at `SPECS` section.\n"
                                                  );
                                        ::std::operator<<(poVar9,"\n");
                                        ::std::__cxx11::ostringstream::str();
                                        PushError(this,(string *)&i_2);
                                        ::std::__cxx11::string::~string((string *)&i_2);
                                        ::std::__cxx11::ostringstream::~ostringstream(local_2040);
                                        this_local._7_1_ = 0;
                                        tmp.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1
                                        ;
                                      }
                                      else {
                                        for (local_2068 = 0; local_2068 != local_5f0;
                                            local_2068 = local_2068 + 1) {
                                          pSVar17 = ::std::
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ::operator[]((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_fc0,local_2068);
                                          SVar2 = *pSVar17;
                                          pvVar18 = ::std::
                                                  vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                                  ::operator[](&this->_specs,local_2068);
                                          pvVar18->spec_type = SVar2;
                                        }
                                        tmp.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0
                                        ;
                                      }
                                      ::std::__cxx11::string::~string((string *)local_1ec8);
                                      if (tmp.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                          == 0) {
                                        if (this->_memoryUsage < __new_size) {
                                          this->_memoryUsage = this->_memoryUsage - __new_size;
                                        }
                                        if (this->_memoryUsage < __new_size_00) {
                                          this->_memoryUsage = this->_memoryUsage - __new_size_00;
                                        }
                                        if (this->_memoryUsage < local_5f0 << 2) {
                                          this->_memoryUsage = this->_memoryUsage + local_5f0 * -4;
                                        }
                                        this_local._7_1_ = 1;
                                        tmp.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1
                                        ;
                                      }
                                    }
                                    else {
                                      ::std::__cxx11::ostringstream::ostringstream(local_1e88);
                                      poVar9 = ::std::operator<<((ostream *)local_1e88,"[error]");
                                      poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                      poVar9 = ::std::operator<<(poVar9,":");
                                      poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                                      poVar9 = ::std::operator<<(poVar9,"():");
                                      poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x17d1);
                                      ::std::operator<<(poVar9," ");
                                      poVar9 = ::std::operator<<((ostream *)local_1e88,
                                                                                                                                  
                                                  "Failed to read spectype data at `SPECS` section."
                                                  );
                                      ::std::operator<<(poVar9,"\n");
                                      ::std::__cxx11::ostringstream::str();
                                      PushError(this,(string *)((long)&err_2.field_2 + 8));
                                      ::std::__cxx11::string::~string
                                                ((string *)(err_2.field_2._M_local_buf + 8));
                                      ::std::__cxx11::ostringstream::~ostringstream(local_1e88);
                                      this_local._7_1_ = 0;
                                      tmp.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                                    }
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream(local_1cf0);
                                    poVar9 = ::std::operator<<((ostream *)local_1cf0,"[error]");
                                    poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                    poVar9 = ::std::operator<<(poVar9,":");
                                    poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                                    poVar9 = ::std::operator<<(poVar9,"():");
                                    poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x17c5);
                                    ::std::operator<<(poVar9," ");
                                    poVar9 = ::std::operator<<((ostream *)local_1cf0,
                                                                                                                              
                                                  "Failed to read spectype size at `SPECS` section."
                                                  );
                                    ::std::operator<<(poVar9,"\n");
                                    ::std::__cxx11::ostringstream::str();
                                    PushError(this,&local_1d10);
                                    ::std::__cxx11::string::~string((string *)&local_1d10);
                                    ::std::__cxx11::ostringstream::~ostringstream(local_1cf0);
                                    this_local._7_1_ = 0;
                                    tmp.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                                  }
                                }
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(local_1990);
                                poVar9 = ::std::operator<<((ostream *)local_1990,"[error]");
                                poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                                poVar9 = ::std::operator<<(poVar9,":");
                                poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                                poVar9 = ::std::operator<<(poVar9,"():");
                                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x17af);
                                ::std::operator<<(poVar9," ");
                                poVar9 = ::std::operator<<((ostream *)local_1990,
                                                                                                                      
                                                  "Failed to read fieldset indexes data at `SPECS` section."
                                                  );
                                ::std::operator<<(poVar9,"\n");
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,(string *)((long)&err_1.field_2 + 8));
                                ::std::__cxx11::string::~string
                                          ((string *)(err_1.field_2._M_local_buf + 8));
                                ::std::__cxx11::ostringstream::~ostringstream(local_1990);
                                this_local._7_1_ = 0;
                                tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                              }
                            }
                            else {
                              ::std::__cxx11::ostringstream::ostringstream(local_17f8);
                              poVar9 = ::std::operator<<((ostream *)local_17f8,"[error]");
                              poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                              poVar9 = ::std::operator<<(poVar9,":");
                              poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                              poVar9 = ::std::operator<<(poVar9,"():");
                              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x17a3);
                              ::std::operator<<(poVar9," ");
                              poVar9 = ::std::operator<<((ostream *)local_17f8,
                                                                                                                  
                                                  "Failed to read fieldset indexes size at `SPECS` section."
                                                  );
                              ::std::operator<<(poVar9,"\n");
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,&local_1818);
                              ::std::__cxx11::string::~string((string *)&local_1818);
                              ::std::__cxx11::ostringstream::~ostringstream(local_17f8);
                              this_local._7_1_ = 0;
                              tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                            }
                          }
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_1498);
                          poVar9 = ::std::operator<<((ostream *)local_1498,"[error]");
                          poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar9 = ::std::operator<<(poVar9,":");
                          poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                          poVar9 = ::std::operator<<(poVar9,"():");
                          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x178d);
                          ::std::operator<<(poVar9," ");
                          poVar9 = ::std::operator<<((ostream *)local_1498,
                                                                                                          
                                                  "Failed to read path indexes data at `SPECS` section."
                                                  );
                          ::std::operator<<(poVar9,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,(string *)((long)&err.field_2 + 8));
                          ::std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
                          ::std::__cxx11::ostringstream::~ostringstream(local_1498);
                          this_local._7_1_ = 0;
                          tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                        }
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_1300);
                        poVar9 = ::std::operator<<((ostream *)local_1300,"[error]");
                        poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                        poVar9 = ::std::operator<<(poVar9,":");
                        poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
                        poVar9 = ::std::operator<<(poVar9,"():");
                        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1781);
                        ::std::operator<<(poVar9," ");
                        poVar9 = ::std::operator<<((ostream *)local_1300,
                                                                                                      
                                                  "Failed to read path indexes size at `SPECS` section."
                                                  );
                        ::std::operator<<(poVar9,"\n");
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_1320);
                        ::std::__cxx11::string::~string((string *)&local_1320);
                        ::std::__cxx11::ostringstream::~ostringstream(local_1300);
                        this_local._7_1_ = 0;
                        tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                      }
                      std::vector<char,_std::allocator<char>_>::~vector
                                ((vector<char,_std::allocator<char>_> *)&path_indexes_size);
                    }
                    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_fc0);
                  }
                  std::vector<char,_std::allocator<char>_>::~vector
                            ((vector<char,_std::allocator<char>_> *)local_e08);
                }
              }
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_768);
            poVar9 = ::std::operator<<((ostream *)local_768,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x1752);
            ::std::operator<<(poVar9," ");
            poVar9 = ::std::operator<<((ostream *)local_768,
                                       "Failed to read # of specs size at `SPECS` section.");
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_788);
            ::std::__cxx11::string::~string((string *)&local_788);
            ::std::__cxx11::ostringstream::~ostringstream(local_768);
            this_local._7_1_ = 0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_5c8);
          poVar9 = ::std::operator<<((ostream *)local_5c8,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x174c);
          ::std::operator<<(poVar9," ");
          poVar9 = ::std::operator<<((ostream *)local_5c8,"Failed to move to `SPECS` section.");
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&num_specs);
          ::std::__cxx11::string::~string((string *)&num_specs);
          ::std::__cxx11::ostringstream::~ostringstream(local_5c8);
          this_local._7_1_ = 0;
        }
      }
      goto LAB_0025ad39;
    }
  }
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  poVar9 = ::std::operator<<((ostream *)local_190,"[error]");
  poVar9 = ::std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                            );
  poVar9 = ::std::operator<<(poVar9,":");
  poVar9 = ::std::operator<<(poVar9,"ReadSpecs");
  poVar9 = ::std::operator<<(poVar9,"():");
  poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x173e);
  ::std::operator<<(poVar9," ");
  poVar9 = ::std::operator<<((ostream *)local_190,"Invalid index for `SPECS` section.");
  ::std::operator<<(poVar9,"\n");
  ::std::__cxx11::ostringstream::str();
  PushError(this,&local_1b0);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  this_local._7_1_ = 0;
LAB_0025ad39:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadSpecs() {
  if ((_specs_index < 0) || (_specs_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR("Invalid index for `SPECS` section.");
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
               "." + std::to_string(_version[2]));
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_specs_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    PUSH_ERROR("Failed to move to `SPECS` section.");
    return false;
  }

  uint64_t num_specs;
  if (!_sr->read8(&num_specs)) {
    PUSH_ERROR("Failed to read # of specs size at `SPECS` section.");
    return false;
  }

  if (num_specs > _config.maxNumSpecifiers) {
    PUSH_ERROR("Too many specs in `SPECS` section.");
    return false;
  }

  if (num_specs == 0) {
    // At least 1 Spec(Root Prim '/') must exist.
    PUSH_ERROR("`SPECS` is empty.");
    return false;
  }

  DCOUT("num_specs " << num_specs);

  CHECK_MEMORY_USAGE(size_t(num_specs) * sizeof(Spec));

  _specs.resize(static_cast<size_t>(num_specs));

  // TODO: Memory size check

  // Create temporary space for decompressing.
  size_t compBufferSize= Usd_IntegerCompression::GetCompressedBufferSize(
      static_cast<size_t>(num_specs));

  CHECK_MEMORY_USAGE(compBufferSize);

  std::vector<char> comp_buffer;
  comp_buffer.resize(compBufferSize);

  CHECK_MEMORY_USAGE(size_t(num_specs) * sizeof(uint32_t)); // tmp

  std::vector<uint32_t> tmp(static_cast<size_t>(num_specs));

  size_t workBufferSize= Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(
          static_cast<size_t>(num_specs));

  CHECK_MEMORY_USAGE(workBufferSize);
  std::vector<char> working_space;
  working_space.resize(workBufferSize);

  // path indices
  {
    uint64_t path_indexes_size;
    if (!_sr->read8(&path_indexes_size)) {
      PUSH_ERROR("Failed to read path indexes size at `SPECS` section.");
      return false;
    }

    if (path_indexes_size > comp_buffer.size()) {
      // Maybe corrupted?
      path_indexes_size = comp_buffer.size();
    }

    if (path_indexes_size !=
        _sr->read(size_t(path_indexes_size), size_t(path_indexes_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read path indexes data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(path_indexes_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode pathIndexes at `SPECS` section.");
      return false;
    }

    for (size_t i = 0; i < num_specs; ++i) {
      DCOUT("spec[" << i << "].path_index = " << tmp[i]);
      _specs[i].path_index.value = tmp[i];
    }
  }

  // fieldset indices
  {
    uint64_t fset_indexes_size;
    if (!_sr->read8(&fset_indexes_size)) {
      PUSH_ERROR("Failed to read fieldset indexes size at `SPECS` section.");
      return false;
    }

    if (fset_indexes_size > comp_buffer.size()) {
      // Maybe corrupted?
      fset_indexes_size = comp_buffer.size();
    }

    if (fset_indexes_size !=
        _sr->read(size_t(fset_indexes_size), size_t(fset_indexes_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read fieldset indexes data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(fset_indexes_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode fieldset indices at `SPECS` section.");
      return false;
    }

    for (size_t i = 0; i != num_specs; ++i) {
      DCOUT("specs[" << i << "].fieldset_index = " << tmp[i]);
      _specs[i].fieldset_index.value = tmp[i];
    }
  }

  // spec types
  {
    uint64_t spectype_size;
    if (!_sr->read8(&spectype_size)) {
      PUSH_ERROR("Failed to read spectype size at `SPECS` section.");
      return false;
    }

    if (spectype_size > comp_buffer.size()) {
      // Maybe corrupted?
      spectype_size = comp_buffer.size();
    }

    if (spectype_size !=
        _sr->read(size_t(spectype_size), size_t(spectype_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read spectype data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used.
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(spectype_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode fieldset indices at `SPECS` section.\n");
      return false;
    }

    for (size_t i = 0; i != num_specs; ++i) {
      // std::cout << "spectype = " << tmp[i] << "\n";
      _specs[i].spec_type = static_cast<SpecType>(tmp[i]);
    }
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i != num_specs; ++i) {
    DCOUT("spec[" << i << "].pathIndex  = " << _specs[i].path_index.value
                  << ", fieldset_index = " << _specs[i].fieldset_index.value
                  << ", spec_type = "
                  << tinyusdz::to_string(_specs[i].spec_type));
    if (auto specstr = GetSpecString(crate::Index(uint32_t(i)))) {
      DCOUT("spec[" << i << "] string_repr = " << specstr.value());
    }
  }
#endif

  REDUCE_MEMORY_USAGE(compBufferSize);
  REDUCE_MEMORY_USAGE(workBufferSize);
  REDUCE_MEMORY_USAGE(size_t(num_specs) * sizeof(uint32_t)); // tmp

  return true;
}